

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

shared_ptr<mocker::ast::Expression> __thiscall
mocker::Parser::prefixUnary(Parser *this,TokIter *iter,TokIter end)

{
  OpType *__args;
  undefined8 this_00;
  Token *pTVar1;
  TokenID TVar2;
  mapped_type *pmVar3;
  CompileError *this_01;
  Token *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  Token *pTVar5;
  __normal_iterator<mocker::ast::UnaryExpr::OpType_*,_std::vector<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>_>
  __tmp;
  shared_ptr<mocker::ast::Expression> *args_1;
  shared_ptr<mocker::ast::Expression> sVar6;
  shared_ptr<mocker::ast::UnaryExpr> sVar7;
  Position beg;
  Position beg_00;
  Position end_00;
  vector<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_> prefix;
  undefined1 local_78 [20];
  uint uStack_64;
  Token *pTStack_60;
  Position local_58;
  Token *local_48;
  Parser *local_40;
  Token *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  
  Token::position(*end._M_current);
  pTVar1 = pTStack_60;
  local_48 = stack0xffffffffffffff98;
  prefix.
  super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  prefix.
  super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  prefix.
  super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar5 = *end._M_current;
  *(Token **)end._M_current = pTVar5 + 1;
  if (pTVar5 != in_RCX) {
    __args = (OpType *)(local_78 + 0x10);
    do {
      TVar2 = Token::tokenID(pTVar5);
      if ((int)TVar2 < 0x2b) {
        if (TVar2 != Plus) {
          if (TVar2 == Minus) {
            stack0xffffffffffffff98 = (Token *)CONCAT44(uStack_64,4);
            if (prefix.
                super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                prefix.
                super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              *prefix.
               super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
               ._M_impl.super__Vector_impl_data._M_finish = Neg;
              goto LAB_0017cb0d;
            }
            std::
            vector<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
            ::_M_realloc_insert<mocker::ast::UnaryExpr::OpType>
                      (&prefix,(iterator)
                               prefix.
                               super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
                               ._M_impl.super__Vector_impl_data._M_finish,__args);
          }
          else {
            if (TVar2 != LogicalNot) {
LAB_0017cc99:
              pTVar5 = *end._M_current;
              goto LAB_0017cb72;
            }
            stack0xffffffffffffff98 = (Token *)CONCAT44(uStack_64,5);
            if (prefix.
                super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                prefix.
                super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              *prefix.
               super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
               ._M_impl.super__Vector_impl_data._M_finish = LogicalNot;
              goto LAB_0017cb0d;
            }
            std::
            vector<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
            ::_M_realloc_insert<mocker::ast::UnaryExpr::OpType>
                      (&prefix,(iterator)
                               prefix.
                               super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
                               ._M_impl.super__Vector_impl_data._M_finish,__args);
          }
        }
      }
      else if (TVar2 == BitNot) {
        stack0xffffffffffffff98 = (Token *)CONCAT44(uStack_64,6);
        if (prefix.
            super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            prefix.
            super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>::
          _M_realloc_insert<mocker::ast::UnaryExpr::OpType>
                    (&prefix,(iterator)
                             prefix.
                             super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
                             ._M_impl.super__Vector_impl_data._M_finish,__args);
        }
        else {
          *prefix.
           super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
           ._M_impl.super__Vector_impl_data._M_finish = BitNot;
LAB_0017cb0d:
          prefix.
          super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               prefix.
               super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
      }
      else if (TVar2 == PlusPlus) {
        stack0xffffffffffffff98 = (Token *)((ulong)uStack_64 << 0x20);
        if (prefix.
            super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            prefix.
            super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          *prefix.
           super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
           ._M_impl.super__Vector_impl_data._M_finish = PreInc;
          goto LAB_0017cb0d;
        }
        std::vector<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
        ::_M_realloc_insert<mocker::ast::UnaryExpr::OpType>
                  (&prefix,(iterator)
                           prefix.
                           super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
                           ._M_impl.super__Vector_impl_data._M_finish,__args);
      }
      else {
        if (TVar2 != MinusMinus) goto LAB_0017cc99;
        stack0xffffffffffffff98 = (Token *)CONCAT44(uStack_64,2);
        if (prefix.
            super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            prefix.
            super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          *prefix.
           super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
           ._M_impl.super__Vector_impl_data._M_finish = PreDec;
          goto LAB_0017cb0d;
        }
        std::vector<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
        ::_M_realloc_insert<mocker::ast::UnaryExpr::OpType>
                  (&prefix,(iterator)
                           prefix.
                           super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
                           ._M_impl.super__Vector_impl_data._M_finish,__args);
      }
      pTVar5 = *end._M_current;
      *(Token **)end._M_current = pTVar5 + 1;
    } while (pTVar5 != in_RCX);
  }
  pTVar5 = pTVar5 + 1;
LAB_0017cb72:
  *(Token **)end._M_current = pTVar5 + -1;
  sVar6 = suffixIncDec((Parser *)local_78,iter,end);
  _Var4 = sVar6.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi;
  if ((Token *)local_78._0_8_ == (Token *)0x0) {
    if (prefix.
        super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        prefix.
        super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      this_01 = (CompileError *)__cxa_allocate_exception(0x48);
      Token::position(*end._M_current);
      beg_00.col = (size_t)pTVar1;
      beg_00.line = (size_t)local_48;
      CompileError::CompileError(this_01,beg_00,local_58);
      *(undefined ***)this_01 = &PTR__CompileError_001eba98;
      __cxa_throw(this_01,&SyntaxError::typeinfo,CompileError::~CompileError);
    }
    (this->tokBeg)._M_current = (Token *)0x0;
    (this->tokEnd)._M_current = (Token *)0x0;
    if ((Token *)local_78._8_8_ != (Token *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
      _Var4._M_pi = extraout_RDX_01;
    }
  }
  else {
    local_40 = this;
    if (prefix.
        super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        prefix.
        super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      args_1 = (shared_ptr<mocker::ast::Expression> *)
               prefix.
               super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      do {
        local_38 = (Token *)local_78._0_8_;
        pmVar3 = std::__detail::
                 _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)iter[2]._M_current,(key_type *)&local_38);
        args_1 = (shared_ptr<mocker::ast::Expression> *)
                 ((long)&args_1[-1].
                         super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 4);
        beg.col = (size_t)local_48;
        beg.line = (size_t)iter;
        end_00.col = (pmVar3->second).line;
        end_00.line = (size_t)pTVar1;
        sVar7 = makeNode<mocker::ast::UnaryExpr,mocker::ast::UnaryExpr::OpType&,std::shared_ptr<mocker::ast::Expression>&>
                          ((Parser *)(local_78 + 0x10),beg,end_00,(OpType *)(pmVar3->second).col,
                           args_1);
        pTVar5 = pTStack_60;
        local_78._0_8_ = stack0xffffffffffffff98;
        this_00 = local_78._8_8_;
        _Var4 = sVar7.super___shared_ptr<mocker::ast::UnaryExpr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
        stack0xffffffffffffff98 = (Token *)0x0;
        pTStack_60 = (Token *)0x0;
        local_78._8_8_ = pTVar5;
        if (((Token *)this_00 != (Token *)0x0) &&
           (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00),
           _Var4._M_pi = extraout_RDX, pTStack_60 != (Token *)0x0)) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pTStack_60);
          _Var4._M_pi = extraout_RDX_00;
        }
      } while (args_1 != (shared_ptr<mocker::ast::Expression> *)
                         prefix.
                         super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
                         ._M_impl.super__Vector_impl_data._M_start);
    }
    (local_40->tokBeg)._M_current = (Token *)local_78._0_8_;
    (local_40->tokEnd)._M_current = (Token *)local_78._8_8_;
    this = local_40;
  }
  if (prefix.
      super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(prefix.
                    super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)prefix.
                          super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)prefix.
                          super__Vector_base<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    _Var4._M_pi = extraout_RDX_02;
  }
  sVar6.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  sVar6.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ast::Expression>)
         sVar6.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ast::Expression> Parser::prefixUnary(TokIter &iter,
                                                     TokIter end) {
  // ++, --, +, -, !, ~
  // prefix '+' will be ignored
  auto begPos = iter->position().first;
  auto id = GetTokenID(end);

  std::vector<ast::UnaryExpr::OpType> prefix;
  bool flag = true;
  while (flag) {
    switch (id(iter++)) {
    case TokenID::PlusPlus:
      prefix.emplace_back(ast::UnaryExpr::PreInc);
      break;
    case TokenID::MinusMinus:
      prefix.emplace_back(ast::UnaryExpr::PreDec);
      break;
    case TokenID::Plus:
      break;
    case TokenID::Minus:
      prefix.emplace_back(ast::UnaryExpr::Neg);
      break;
    case TokenID::LogicalNot:
      prefix.emplace_back(ast::UnaryExpr::LogicalNot);
      break;
    case TokenID::BitNot:
      prefix.emplace_back(ast::UnaryExpr::BitNot);
      break;
    default:
      --iter;
      flag = false;
      break;
    }
  }

  auto res = suffixIncDec(iter, end);
  if (!res) {
    if (prefix.empty())
      return nullptr;
    throw SyntaxError(begPos, iter->position().second);
  }

  for (auto riter = prefix.rbegin(); riter != prefix.rend(); ++riter)
    res =
        makeNode<ast::UnaryExpr>(begPos, pos[res->getID()].second, *riter, res);

  return res;
}